

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O1

vector<long,_std::allocator<long>_> * __thiscall
TSMuxer::getFirstPts(vector<long,_std::allocator<long>_> *__return_storage_ptr__,TSMuxer *this)

{
  long *plVar1;
  iterator __position;
  long *i;
  long *plVar2;
  long local_38;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::reserve
            (__return_storage_ptr__,
             (long)(this->m_firstPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_firstPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  plVar1 = (this->m_firstPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (plVar2 = (this->m_firstPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start; plVar2 != plVar1; plVar2 = plVar2 + 1) {
    local_38 = *plVar2 / 0xe5b0 + this->m_timeOffset;
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                (__return_storage_ptr__,__position,&local_38);
    }
    else {
      *__position._M_current = local_38;
      (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int64_t> TSMuxer::getFirstPts() const
{
    std::vector<int64_t> rez;
    rez.reserve(m_firstPts.size());
    for (const auto& i : m_firstPts) rez.push_back(internalClockToPts(i) + m_timeOffset);
    return rez;
}